

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableValue.cpp
# Opt level: O3

void __thiscall VariableValue::SetValue(VariableValue *this,Value *object)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  runtime_error *this_00;
  bool bVar2;
  long *local_78;
  size_t local_70;
  long local_68 [2];
  _Hashtable<Symbol,_std::pair<const_Symbol,_Value_*>,_std::allocator<std::pair<const_Symbol,_Value_*>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_58;
  
  iVar1 = (*object->_vptr_Value[3])(object);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar1))
            (&local_58,(undefined8 *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*(this->super_Value)._vptr_Value[3])(this);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var_00,iVar1))
            (&local_78,(undefined8 *)CONCAT44(extraout_var_00,iVar1));
  if (local_58._M_bucket_count == local_70) {
    if (local_58._M_bucket_count == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_58._M_buckets,local_78,local_58._M_bucket_count);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if ((__node_base *)local_58._M_buckets != &local_58._M_before_begin) {
    operator_delete(local_58._M_buckets,
                    (ulong)((long)&(local_58._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  if (bVar2) {
    iVar1 = (*object->_vptr_Value[3])(object);
    this->type_ = (PrimitiveSimpleObject *)CONCAT44(extraout_var_01,iVar1);
    iVar1 = (*object->_vptr_Value[2])(object);
    this->value_ = iVar1;
    (*object->_vptr_Value[4])(&local_58,object);
    std::
    _Hashtable<Symbol,_std::pair<const_Symbol,_Value_*>,_std::allocator<std::pair<const_Symbol,_Value_*>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(&(this->fields_)._M_h,&local_58);
    std::
    _Hashtable<Symbol,_std::pair<const_Symbol,_Value_*>,_std::allocator<std::pair<const_Symbol,_Value_*>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_58);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Different types");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void VariableValue::SetValue(Value* object) {
  if (object->GetType()->GetTypename() == this->GetType()->GetTypename()) {
    type_ = (PrimitiveSimpleObject*)object->GetType();
  } else {
    throw std::runtime_error("Different types");
  }
  value_ = object->GetValue();
  fields_ = std::move(object->GetFields());
}